

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleTypeHandler.cpp
# Opt level: O0

ES5ArrayTypeHandlerBase<unsigned_short> * __thiscall
Js::SimpleTypeHandler<1ul>::ConvertToTypeHandler<Js::ES5ArrayTypeHandlerBase<unsigned_short>>
          (SimpleTypeHandler<1ul> *this,DynamicObject *instance)

{
  code *pcVar1;
  DynamicType *pDVar2;
  bool bVar3;
  BYTE values;
  PropertyTypes values_00;
  uint16 inlineSlotCapacity;
  uint16 offsetOfInlineSlots;
  int slotCapacity;
  PropertyId PVar4;
  BOOL BVar5;
  Recycler *alloc;
  ES5ArrayTypeHandlerBase<unsigned_short> *pEVar6;
  undefined4 *puVar7;
  Var aValue;
  PropertyRecord *pPVar8;
  PropertyRecord **ppPVar9;
  bool local_bb;
  bool local_ba;
  bool local_b9;
  bool markAsFixed;
  Var value;
  int i;
  bool allowFixedFields;
  bool hasSingletonInstance;
  TrackAllocData local_60;
  ES5ArrayTypeHandlerBase<unsigned_short> *local_38;
  ES5ArrayTypeHandlerBase<unsigned_short> *newTypeHandler;
  DynamicType *oldType;
  Recycler *recycler;
  ScriptContext *scriptContext;
  DynamicObject *instance_local;
  SimpleTypeHandler<1UL> *this_local;
  
  scriptContext = (ScriptContext *)instance;
  instance_local = (DynamicObject *)this;
  recycler = (Recycler *)RecyclableObject::GetScriptContext(&instance->super_RecyclableObject);
  oldType = (DynamicType *)ScriptContext::GetRecycler((ScriptContext *)recycler);
  newTypeHandler =
       (ES5ArrayTypeHandlerBase<unsigned_short> *)
       DynamicObject::GetDynamicType((DynamicObject *)scriptContext);
  pDVar2 = oldType;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_60,(type_info *)&ES5ArrayTypeHandlerBase<unsigned_short>::typeinfo,0,
             0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleTypeHandler.cpp"
             ,0x87);
  alloc = Memory::Recycler::TrackAllocInfo((Recycler *)pDVar2,&local_60);
  pEVar6 = (ES5ArrayTypeHandlerBase<unsigned_short> *)new<Memory::Recycler>(0x40,alloc,0x43c4b0);
  pDVar2 = oldType;
  slotCapacity = DynamicTypeHandler::GetSlotCapacity((DynamicTypeHandler *)this);
  inlineSlotCapacity = DynamicTypeHandler::GetInlineSlotCapacity((DynamicTypeHandler *)this);
  offsetOfInlineSlots = DynamicTypeHandler::GetOffsetOfInlineSlots((DynamicTypeHandler *)this);
  ES5ArrayTypeHandlerBase<unsigned_short>::ES5ArrayTypeHandlerBase
            (pEVar6,(Recycler *)pDVar2,slotCapacity,inlineSlotCapacity,offsetOfInlineSlots);
  local_38 = pEVar6;
  bVar3 = SimpleTypeHandler<1UL>::HasSingletonInstanceOnlyIfNeeded((SimpleTypeHandler<1UL> *)this);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleTypeHandler.cpp"
                                ,0x89,"(HasSingletonInstanceOnlyIfNeeded())",
                                "HasSingletonInstanceOnlyIfNeeded()");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  bVar3 = DynamicTypeHandler::SetSingletonInstanceIfNeeded
                    ((DynamicTypeHandler *)local_38,(DynamicObject *)scriptContext);
  local_b9 = false;
  if (bVar3) {
    local_b9 = DynamicObject::HasLockedType((DynamicObject *)scriptContext);
  }
  value._0_4_ = 0;
  do {
    pEVar6 = local_38;
    if (*(int *)(this + 0x18) <= (int)value) {
      values = DynamicTypeHandler::GetFlags((DynamicTypeHandler *)this);
      DynamicTypeHandler::SetFlags((DynamicTypeHandler *)pEVar6,'\"',values);
      BVar5 = DynamicTypeHandler::IsPathTypeHandler((DynamicTypeHandler *)local_38);
      if (BVar5 != 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleTypeHandler.cpp"
                                    ,0xa2,"(!newTypeHandler->IsPathTypeHandler())",
                                    "!newTypeHandler->IsPathTypeHandler()");
        if (!bVar3) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 0;
      }
      bVar3 = DynamicTypeHandler::GetIsInlineSlotCapacityLocked((DynamicTypeHandler *)local_38);
      if (!bVar3) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleTypeHandler.cpp"
                                    ,0xa3,"(newTypeHandler->GetIsInlineSlotCapacityLocked())",
                                    "newTypeHandler->GetIsInlineSlotCapacityLocked()");
        if (!bVar3) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 0;
      }
      pEVar6 = local_38;
      values_00 = DynamicTypeHandler::GetPropertyTypes((DynamicTypeHandler *)this);
      DynamicTypeHandler::SetPropertyTypes((DynamicTypeHandler *)pEVar6,0xb0,values_00);
      ES5ArrayTypeHandlerBase<unsigned_short>::SetInstanceTypeHandler
                (local_38,(DynamicObject *)scriptContext,true);
      if (local_b9 != false) {
        pEVar6 = (ES5ArrayTypeHandlerBase<unsigned_short> *)
                 DynamicObject::GetDynamicType((DynamicObject *)scriptContext);
        if (pEVar6 == newTypeHandler) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar7 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleTypeHandler.cpp"
                                      ,0xa9,
                                      "(!allowFixedFields || instance->GetDynamicType() != oldType)"
                                      ,"!allowFixedFields || instance->GetDynamicType() != oldType")
          ;
          if (!bVar3) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar7 = 0;
        }
      }
      return local_38;
    }
    aValue = DynamicObject::GetSlot((DynamicObject *)scriptContext,(int)value);
    if (aValue == (Var)0x0) {
      pPVar8 = Memory::WriteBarrierPtr<const_Js::PropertyRecord>::operator->
                         ((WriteBarrierPtr<const_Js::PropertyRecord> *)
                          (this + (long)(int)value * 0x10 + 0x20));
      PVar4 = PropertyRecord::GetPropertyId(pPVar8);
      BVar5 = IsInternalPropertyId(PVar4);
      if (BVar5 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleTypeHandler.cpp"
                                    ,0x95,
                                    "(value != nullptr || IsInternalPropertyId(descriptors[i].Id->GetPropertyId()))"
                                    ,
                                    "value != nullptr || IsInternalPropertyId(descriptors[i].Id->GetPropertyId())"
                                   );
        if (!bVar3) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 0;
      }
    }
    local_ba = false;
    if (local_b9 != false) {
      pPVar8 = Memory::WriteBarrierPtr<const_Js::PropertyRecord>::operator->
                         ((WriteBarrierPtr<const_Js::PropertyRecord> *)
                          (this + (long)(int)value * 0x10 + 0x20));
      PVar4 = PropertyRecord::GetPropertyId(pPVar8);
      BVar5 = IsInternalPropertyId(PVar4);
      local_ba = false;
      if (BVar5 == 0) {
        bVar3 = VarIs<Js::JavascriptFunction>(aValue);
        if (bVar3) {
          local_bb = DynamicTypeHandler::ShouldFixMethodProperties();
        }
        else {
          local_bb = false;
        }
        local_ba = local_bb;
      }
    }
    pEVar6 = local_38;
    ppPVar9 = Memory::PointerValue<Js::PropertyRecord_const>
                        ((WriteBarrierPtr<const_Js::PropertyRecord> *)
                         (this + (long)(int)value * 0x10 + 0x20));
    DictionaryTypeHandlerBase<unsigned_short>::Add
              (&pEVar6->super_DictionaryTypeHandlerBase<unsigned_short>,*ppPVar9,
               (PropertyAttributes)this[(long)(int)value * 0x10 + 0x28],true,local_ba,false,
               (ScriptContext *)recycler);
    value._0_4_ = (int)value + 1;
  } while( true );
}

Assistant:

T* SimpleTypeHandler<size>::ConvertToTypeHandler(DynamicObject* instance)
    {
        ScriptContext* scriptContext = instance->GetScriptContext();
        Recycler* recycler = scriptContext->GetRecycler();

#if ENABLE_FIXED_FIELDS && DBG
        DynamicType* oldType = instance->GetDynamicType();
#endif

        T* newTypeHandler = RecyclerNew(recycler, T, recycler, SimpleTypeHandler<size>::GetSlotCapacity(), GetInlineSlotCapacity(), GetOffsetOfInlineSlots());
#if ENABLE_FIXED_FIELDS
        Assert(HasSingletonInstanceOnlyIfNeeded());

        bool const hasSingletonInstance = newTypeHandler->SetSingletonInstanceIfNeeded(instance);
        // If instance has a shared type, the type handler change below will induce a type transition, which
        // guarantees that any existing fast path field stores (which could quietly overwrite a fixed field
        // on this instance) will be invalidated.  It is safe to mark all fields as fixed.
        bool const allowFixedFields = hasSingletonInstance && instance->HasLockedType();
#endif

        for (int i = 0; i < propertyCount; i++)
        {
            Var value = instance->GetSlot(i);
            Assert(value != nullptr || IsInternalPropertyId(descriptors[i].Id->GetPropertyId()));
#if ENABLE_FIXED_FIELDS
            bool markAsFixed = allowFixedFields && !IsInternalPropertyId(descriptors[i].Id->GetPropertyId()) &&
                (VarIs<JavascriptFunction>(value) ? ShouldFixMethodProperties() : false);
#else
            bool markAsFixed = false;
#endif
            newTypeHandler->Add(PointerValue(descriptors[i].Id), descriptors[i].Attributes, true, markAsFixed, false, scriptContext);
        }

        newTypeHandler->SetFlags(IsPrototypeFlag | HasKnownSlot0Flag, this->GetFlags());
        // We don't expect to convert to a PathTypeHandler.  If we change this later we need to review if we want the new type handler to have locked
        // inline slot capacity, or if we want to allow shrinking of the SimpleTypeHandler's inline slot capacity.
        Assert(!newTypeHandler->IsPathTypeHandler());
        Assert(newTypeHandler->GetIsInlineSlotCapacityLocked());
        newTypeHandler->SetPropertyTypes(PropertyTypesWritableDataOnly | PropertyTypesWritableDataOnlyDetection | PropertyTypesHasSpecialProperties, this->GetPropertyTypes());
        newTypeHandler->SetInstanceTypeHandler(instance);

#if ENABLE_FIXED_FIELDS && DBG
        // If we marked fields as fixed we had better forced a type transition.
        Assert(!allowFixedFields || instance->GetDynamicType() != oldType);
#endif

        return newTypeHandler;
    }